

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::forthscriptcpp_reset(Forth *this)

{
  value_type vVar1;
  reference pvVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  rep local_18;
  Forth *local_10;
  Forth *this_local;
  
  local_10 = this;
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_28);
  local_18 = (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                            (&local_20);
  (this->executionStarted).__r = local_18;
  ForthStack<unsigned_int>::resize(&this->dStack,this->FORTHSCRIPTCPP_DSTACK_COUNT);
  ForthStack<unsigned_int>::resetStack(&this->dStack);
  ForthStack<unsigned_int>::resize(&this->rStack,this->FORTHSCRIPTCPP_RSTACK_COUNT);
  ForthStack<unsigned_int>::resetStack(&this->rStack);
  ForthStack<unsigned_int>::resize(&this->returnStack,0x1000);
  virtualMemoryInit(this);
  setSourceId(this,0);
  setNumericBase(this,10);
  setIsCompiling(this,this->False);
  setDataCell(this,this->VarOffsetBlkAddress,0);
  this->searchOrderCurrent = this->widForthWordList;
  this->searchOrderLast = this->widForthAssembler;
  std::vector<int,_std::allocator<int>_>::resize(&this->searchOrder,2);
  vVar1 = this->widForthWordList;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->searchOrder,0);
  *pvVar2 = vVar1;
  vVar1 = this->widForthWordList;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->searchOrder,1);
  *pvVar2 = vVar1;
  initializeDefinitions(this);
  return;
}

Assistant:

void forthscriptcpp_reset() {
			executionStarted = std::chrono::duration_cast< std::chrono::milliseconds >(
				std::chrono::system_clock::now().time_since_epoch() );
			dStack.resize(FORTHSCRIPTCPP_DSTACK_COUNT);
			dStack.resetStack();
			rStack.resize(FORTHSCRIPTCPP_RSTACK_COUNT);
			rStack.resetStack();
			// return stack init;
			returnStack.resize(4096);

			virtualMemoryInit();
			
			setSourceId(0); // SOURCE-ID=0: user input 
			setNumericBase(10); // BASE = 10
			setIsCompiling(False);
			setDataCell(VarOffsetBlkAddress, Cell(0)); // set BLK=0
			
			// search order setup
			searchOrderCurrent=widForthWordList;
			searchOrderLast=widForthAssembler;
			searchOrder.resize(2);
			searchOrder[0]=widForthWordList;
			searchOrder[1]=widForthWordList;
			initializeDefinitions();
		}